

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O3

int Abc_ZddPerm2Comb(int *pPerm,int Size,int *pComb)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (Size < 1) {
    iVar3 = 0;
  }
  else {
    uVar4 = 0;
    iVar3 = 0;
    do {
      uVar5 = uVar4;
      if (uVar4 != (uint)pPerm[uVar4]) {
        do {
          if (Size - 1 == uVar5) {
            uVar5 = (ulong)(uint)Size;
            uVar6 = (ulong)(uint)Size;
            goto LAB_00493d02;
          }
          lVar2 = uVar5 + 1;
          uVar5 = uVar5 + 1;
        } while (uVar4 != (uint)pPerm[lVar2]);
        uVar6 = uVar5 & 0xffffffff;
LAB_00493d02:
        pComb[iVar3] = (int)uVar4 << 0x10 | (uint)uVar5;
        iVar1 = pPerm[uVar4];
        pPerm[uVar4] = pPerm[uVar6];
        pPerm[uVar6] = iVar1;
        if (uVar4 != (uint)pPerm[uVar4]) {
          __assert_fail("i == pPerm[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPerm.c"
                        ,0x287,"int Abc_ZddPerm2Comb(int *, int, int *)");
        }
        iVar3 = iVar3 + 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)Size);
  }
  return iVar3;
}

Assistant:

int Abc_ZddPerm2Comb( int * pPerm, int Size, int * pComb )
{
    int i, j, nTrans = 0;
    for ( i = 0; i < Size; i++ )
        if ( i != pPerm[i] )
        {
            for ( j = i+1; j < Size; j++ )
                if ( i == pPerm[j] )
                    break;
            pComb[nTrans++] = (i << 16) | j;
            ABC_SWAP( int, pPerm[i], pPerm[j] );
            assert( i == pPerm[i] );
        }
    return nTrans;
}